

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtypedh.cpp
# Opt level: O1

void vmb_get_dh_val(char *buf,vm_val_t *val)

{
  vm_prop_id_t vVar1;
  
  switch(*buf) {
  case '\x05':
  case '\a':
  case '\b':
  case '\t':
  case '\n':
  case '\v':
  case '\f':
  case '\x0f':
  case '\x11':
    (val->val).obj = *(vm_obj_id_t *)(buf + 1);
    return;
  case '\x06':
    vVar1 = *(vm_prop_id_t *)(buf + 1);
    break;
  default:
    return;
  case '\x10':
  case '\x12':
    (val->val).bifptr.func_idx = *(unsigned_short *)(buf + 1);
    vVar1 = *(vm_prop_id_t *)(buf + 3);
  }
  (val->val).prop = vVar1;
  return;
}

Assistant:

void vmb_get_dh_val(const char *buf, vm_val_t *val)
{
    /* read the format appropriate to the type */
    switch((vm_datatype_t)buf[0])
    {
    case VM_OBJ:
    case VM_OBJX:
        /* get the object ID from the UINT4 */
        val->val.obj = (vm_obj_id_t)t3rp4u(buf+1);
        break;

    case VM_PROP:
        /* get the property ID from the UINT2 */
        val->val.prop = (vm_prop_id_t)osrp2(buf+1);
        break;

    case VM_INT:
        val->val.intval = osrp4(buf+1);
        break;

    case VM_BIFPTR:
    case VM_BIFPTRX:
        /* read the function index and set index as UINT2s */
        val->val.bifptr.func_idx = osrp2(buf+1);
        val->val.bifptr.set_idx = osrp2(buf+3);
        break;

    case VM_ENUM:
        /* get the enumerated constant value from the UINT4 */
        val->val.enumval = t3rp4u(buf+1);
        break;

    case VM_SSTRING:
    case VM_DSTRING:
    case VM_LIST:
    case VM_CODEOFS:
    case VM_FUNCPTR:
        /* get the offset value from the UINT4 */
        val->val.ofs = t3rp4u(buf+1);
        break;

    default:
        /* other types have no additional data or cannot be put in a DH */
        break;
    }
}